

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

void tss_load_seg(CPUX86State *env,int seg_reg,int selector,int cpl,uintptr_t retaddr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  uint uVar4;
  int exception_index;
  uint uVar5;
  abi_ptr addr;
  uint uVar6;
  
  uVar6 = selector & 0xfffc;
  if (uVar6 == 0) {
    if (1 < seg_reg - 1U) {
      return;
    }
    uVar6 = 0;
LAB_0051cb40:
    raise_exception_err_ra_x86_64(env,10,uVar6,retaddr);
  }
  lVar3 = 0x148;
  if ((selector & 4U) == 0) {
    lVar3 = 0x178;
  }
  if (*(uint *)((long)env->regs + lVar3 + 0x10) < (selector | 7U)) goto LAB_0051cb40;
  uVar5 = 2;
  uVar4 = 2;
  addr = (long)(int)(selector & 0xfffffff8) + *(long *)((long)env->regs + lVar3 + 8);
  if (((env->hflags >> 0x17 & 1) != 0) && (uVar4 = 0, (~env->hflags & 3) != 0)) {
    uVar4 = (uint)env->eflags >> 0x11 & 2;
  }
  uVar1 = cpu_ldl_mmuidx_ra_x86_64(env,addr,uVar4,retaddr);
  if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
    uVar5 = (uint)env->eflags >> 0x11 & 2;
  }
  uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,uVar5,retaddr);
  if ((uVar2 >> 0xc & 1) != 0) {
    uVar4 = uVar2 >> 0xd & 3;
    if (seg_reg == 2) {
      if (((uVar2 & 0xa00) == 0x200) && (uVar4 == cpl)) {
LAB_0051c9ae:
        if (uVar4 == (selector & 3U)) {
LAB_0051c9e9:
          if ((short)uVar2 < 0) {
            uVar5 = uVar2 & 0xf0000 | uVar1 & 0xffff;
            uVar6 = uVar5 << 0xc | 0xfff;
            if ((uVar2 >> 0x17 & 1) == 0) {
              uVar6 = uVar5;
            }
            env->segs[seg_reg].selector = selector;
            env->segs[seg_reg].base =
                 (ulong)(uVar2 & 0xff000000 | uVar1 >> 0x10 | (uVar2 & 0xff) << 0x10);
            env->segs[seg_reg].limit = uVar6;
            env->segs[seg_reg].flags = uVar2;
            if (seg_reg == 2) {
              env->hflags = env->hflags & 0xfffffffc | uVar4;
              cpu_sync_bndcs_hflags_x86_64(env);
            }
            else if (seg_reg == 1) {
              uVar6 = env->hflags;
              if ((uVar2 >> 0x15 & 1) == 0 || (uVar6 >> 0xe & 1) == 0) {
                uVar6 = uVar6 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
              }
              else {
                uVar6 = uVar6 & 0xffff7f8f | 0x8030;
              }
              env->hflags = uVar6;
            }
            uVar6 = env->hflags;
            uVar4 = env->segs[2].flags >> 0x11 & 0x20;
            if (-1 < (short)uVar6) {
              if ((((env->cr[0] & 1) == 0) || ((uVar6 & 0x10) == 0)) ||
                 ((env->eflags & 0x20000) != 0)) {
                uVar4 = uVar4 | 0x40;
              }
              else {
                uVar4 = uVar4 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                      env->segs[2].base != 0) << 6;
              }
            }
            env->hflags = uVar6 & 0xffffff9f | uVar4;
            return;
          }
          exception_index = 0xb;
          goto LAB_0051cb50;
        }
      }
    }
    else if (seg_reg == 1) {
      if ((uVar2 >> 0xb & 1) != 0) goto LAB_0051c9ae;
    }
    else if (((uVar2 & 0xa00) != 0x800) &&
            (((~uVar2 & 0xc00) == 0 || ((cpl <= (int)uVar4 && ((selector & 3U) <= uVar4))))))
    goto LAB_0051c9e9;
  }
  exception_index = 10;
LAB_0051cb50:
  raise_exception_err_ra_x86_64(env,exception_index,uVar6,retaddr);
}

Assistant:

static void tss_load_seg(CPUX86State *env, int seg_reg, int selector, int cpl,
                         uintptr_t retaddr)
{
    uint32_t e1, e2;
    int rpl, dpl;

    if ((selector & 0xfffc) != 0) {
        if (load_segment_ra(env, &e1, &e2, selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_S_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        rpl = selector & 3;
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (seg_reg == R_CS) {
            if (!(e2 & DESC_CS_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else if (seg_reg == R_SS) {
            /* SS must be writable data */
            if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != cpl || dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else {
            /* not readable code */
            if ((e2 & DESC_CS_MASK) && !(e2 & DESC_R_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            /* if data or non conforming code, checks the rights */
            if (((e2 >> DESC_TYPE_SHIFT) & 0xf) < 12) {
                if (dpl < cpl || dpl < rpl) {
                    raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
                }
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, retaddr);
        }
        cpu_x86_load_seg_cache(env, seg_reg, selector,
                               get_seg_base(e1, e2),
                               get_seg_limit(e1, e2),
                               e2);
    } else {
        if (seg_reg == R_SS || seg_reg == R_CS) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
    }
}